

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

VkResult Fossilize::CreateRayTracingPipelinesKHR
                   (VkDevice device,VkDeferredOperationKHR deferredOperation,
                   VkPipelineCache pipelineCache,uint32_t createInfoCount,
                   VkRayTracingPipelineCreateInfoKHR *pCreateInfos,VkAllocationCallbacks *pAllocator
                   ,VkPipeline *pPipelines)

{
  Instance *pIVar1;
  undefined4 uVar2;
  bool bVar3;
  uint32_t i_4;
  VkResult VVar4;
  VkResult VVar5;
  VkResult VVar6;
  LogLevel LVar7;
  Device *this;
  VkPipelineCreateFlags2KHR VVar8;
  void *pvVar9;
  void *pvVar10;
  PFN_vkGetShaderModuleCreateInfoIdentifierEXT p_Var11;
  VkRayTracingPipelineCreateInfoKHR *pVVar12;
  ulong count;
  long lVar13;
  uint32_t i_1;
  uint uVar14;
  VkPipeline pipeline;
  VkRayTracingPipelineCreateInfoKHR *pVVar15;
  uint32_t i;
  VkPipeline *ppVVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  long lVar20;
  VkPipeline *ppVVar21;
  void **outpNext;
  bool bVar22;
  byte bVar23;
  VkRayTracingPipelineCreateInfoKHR local_98;
  
  bVar23 = 0;
  this = get_device_layer((Fossilize *)device,(VkDevice)deferredOperation);
  pIVar1 = this->pInstance;
  count = (ulong)createInfoCount;
  if ((pIVar1->enableCrashHandler == false) && ((pIVar1->synchronized & 1U) == 0)) {
    bVar22 = true;
    bVar3 = true;
    if ((createInfoCount != 0) && (pIVar1->enablePrecompileQA != false)) {
      for (sVar19 = 0; count * 0x68 != sVar19; sVar19 = sVar19 + 0x68) {
        VVar8 = getEffectivePipelineFlags<VkRayTracingPipelineCreateInfoKHR>
                          ((VkRayTracingPipelineCreateInfoKHR *)
                           ((long)&pCreateInfos->sType + sVar19));
        pvVar10 = *(void **)((long)&pCreateInfos->pNext + sVar19);
        pvVar9 = findpNext(pvVar10,VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR);
        pvVar10 = findpNext(pvVar10,VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR);
        bVar3 = bVar22;
        if ((pvVar10 != (void *)0x0) && (*(int *)((long)pvVar10 + 0x10) != 0)) goto LAB_0011149f;
        uVar14 = (uint)VVar8;
        if (pvVar9 == (void *)0x0) {
          if ((uVar14 >> 8 & 1) != 0) goto LAB_0011149f;
        }
        else if (((uVar14 >> 8 & 1) != 0) ||
                ((uVar14 >> 10 & 1) == 0 && *(int *)((long)pvVar9 + 0x10) != 0)) goto LAB_0011149f;
      }
      ScratchAllocator::ScratchAllocator((ScratchAllocator *)&local_98);
      pVVar12 = ScratchAllocator::allocate_n<VkRayTracingPipelineCreateInfoKHR>
                          ((ScratchAllocator *)&local_98,count);
      memcpy(pVVar12,pCreateInfos,count * 0x68);
      outpNext = &pVVar12->pNext;
      uVar18 = count;
      while (bVar3 = uVar18 != 0, uVar18 = uVar18 - 1, bVar3) {
        *(byte *)((long)outpNext + 9) = *(byte *)((long)outpNext + 9) | 1;
        bVar3 = shallowCopyPnextChain((ScratchAllocator *)&local_98,*outpNext,outpNext);
        if (!bVar3) {
          bVar22 = false;
          goto LAB_0011140c;
        }
        pvVar10 = findpNext(*outpNext,VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO);
        if (pvVar10 != (void *)0x0) {
          *(byte *)((long)pvVar10 + 0x11) = *(byte *)((long)pvVar10 + 0x11) | 1;
        }
        outpNext = outpNext + 0xd;
      }
      VVar5 = (*this->pTable->CreateRayTracingPipelinesKHR)
                        (device,(VkDeferredOperationKHR)0x0,(VkPipelineCache)0x0,createInfoCount,
                         pVVar12,pAllocator,pPipelines);
      if (VVar5 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) {
        pVVar12 = pCreateInfos;
        for (uVar18 = 0; count != uVar18; uVar18 = uVar18 + 1) {
          if (pPipelines[uVar18] == (VkPipeline)0x0) {
            pvVar10 = findpNext(pVVar12->pNext,VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO
                               );
            if (pvVar10 == (void *)0x0) {
              uVar17 = (ulong)pVVar12->flags;
            }
            else {
              uVar17 = *(ulong *)((long)pvVar10 + 0x10);
            }
            LVar7 = get_thread_log_level();
            if ((int)LVar7 < 2) {
              bVar3 = Internal::log_thread_callback
                                (LOG_DEFAULT,
                                 "QA: Pipeline compilation required for pipeline, flags %08x\'%08x.\n"
                                 ,uVar17 >> 0x20,uVar17);
              if (!bVar3) {
                fprintf(_stderr,
                        "Fossilize WARN: QA: Pipeline compilation required for pipeline, flags %08x\'%08x.\n"
                        ,uVar17 >> 0x20,uVar17 & 0xffffffff);
              }
            }
            Device::registerPrecompileQAFailure(this,1);
            if (this->usesModuleIdentifiers == true) {
              p_Var11 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
            }
            else {
              p_Var11 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
            }
            bVar3 = StateRecorder::record_raytracing_pipeline
                              (this->recorder,pPipelines[uVar18],pVVar12,pPipelines,createInfoCount,
                               0,device,p_Var11);
            if (((!bVar3) && (LVar7 = get_thread_log_level(), (int)LVar7 < 2)) &&
               (bVar3 = Internal::log_thread_callback
                                  (LOG_DEFAULT,
                                   "Recording graphics pipeline failed, usually caused by unsupported pNext.\n"
                                  ), !bVar3)) {
              fwrite("Fossilize WARN: Recording graphics pipeline failed, usually caused by unsupported pNext.\n"
                     ,0x59,1,_stderr);
            }
          }
          else {
            Device::registerPrecompileQASuccess(this,1);
          }
          pVVar12 = pVVar12 + 1;
        }
        for (uVar18 = 0; count != uVar18; uVar18 = uVar18 + 1) {
          (*this->pTable->DestroyPipeline)(this->device,pPipelines[uVar18],pAllocator);
          pPipelines[uVar18] = (VkPipeline)0x0;
        }
        bVar22 = false;
      }
      else {
        Device::registerPrecompileQASuccess(this,createInfoCount);
        bVar22 = VVar5 == VK_SUCCESS;
      }
LAB_0011140c:
      ScratchAllocator::~ScratchAllocator((ScratchAllocator *)&local_98);
      uVar18 = 0xffffffffffffffff;
      pVVar12 = pCreateInfos;
      do {
        uVar17 = count;
        if (uVar18 - count == -1) break;
        VVar8 = getEffectivePipelineFlags<VkRayTracingPipelineCreateInfoKHR>(pVVar12);
        uVar17 = uVar18 + 1;
        pVVar12 = pVVar12 + 1;
        uVar18 = uVar17;
      } while (((uint)VVar8 >> 0xb & 1) == 0);
      bVar3 = uVar17 < count;
      if (bVar22 && deferredOperation != (VkDeferredOperationKHR)0x0) {
        for (uVar18 = 0; count != uVar18; uVar18 = uVar18 + 1) {
          (*this->pTable->DestroyPipeline)(device,pPipelines[uVar18],pAllocator);
          pPipelines[uVar18] = (VkPipeline)0x0;
        }
      }
    }
LAB_0011149f:
    VVar6 = (*this->pTable->CreateRayTracingPipelinesKHR)
                      (device,deferredOperation,pipelineCache,createInfoCount,pCreateInfos,
                       pAllocator,pPipelines);
    if ((((uint)(VVar6 + ~VK_THREAD_DONE_KHR) < 2) || (VVar6 == VK_SUCCESS)) && (bVar3)) {
      for (uVar18 = 0; count != uVar18; uVar18 = uVar18 + 1) {
        if (this->usesModuleIdentifiers == true) {
          p_Var11 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
        }
        else {
          p_Var11 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
        }
        bVar3 = StateRecorder::record_raytracing_pipeline
                          (this->recorder,pPipelines[uVar18],pCreateInfos,pPipelines,createInfoCount
                           ,0,device,p_Var11);
        if (((!bVar3) && (LVar7 = get_thread_log_level(), (int)LVar7 < 2)) &&
           (bVar3 = Internal::log_thread_callback
                              (LOG_DEFAULT,
                               "Failed to record compute pipeline, usually caused by unsupported pNext.\n"
                              ), !bVar3)) {
          fwrite("Fossilize WARN: Failed to record compute pipeline, usually caused by unsupported pNext.\n"
                 ,0x58,1,_stderr);
        }
        pCreateInfos = pCreateInfos + 1;
      }
    }
  }
  else {
    for (uVar18 = 0; count != uVar18; uVar18 = uVar18 + 1) {
      pPipelines[uVar18] = (VkPipeline)0x0;
    }
    lVar20 = 0;
    VVar5 = VK_SUCCESS;
    ppVVar16 = pPipelines;
    ppVVar21 = pPipelines;
LAB_00110f7a:
    VVar4 = (VkResult)ppVVar21;
    if (-count == lVar20) {
      bVar3 = true;
    }
    else {
      pVVar12 = pCreateInfos;
      pVVar15 = &local_98;
      for (lVar13 = 0xd; lVar13 != 0; lVar13 = lVar13 + -1) {
        uVar2 = *(undefined4 *)&pVVar12->field_0x4;
        pVVar15->sType = pVVar12->sType;
        *(undefined4 *)&pVVar15->field_0x4 = uVar2;
        pVVar12 = (VkRayTracingPipelineCreateInfoKHR *)((long)pVVar12 + (ulong)bVar23 * -0x10 + 8);
        pVVar15 = (VkRayTracingPipelineCreateInfoKHR *)
                  ((long)pVVar15 + ((ulong)bVar23 * -2 + 1) * 8);
      }
      if ((-1 < local_98.basePipelineIndex &
          local_98.basePipelineHandle == (VkPipeline)0x0 & (byte)local_98.flags >> 2) == 1) {
        local_98.basePipelineHandle = pPipelines[(uint)local_98.basePipelineIndex];
        local_98.basePipelineIndex = 0xffffffff;
      }
      if (this->pInstance->synchronized == true) {
        if (this->usesModuleIdentifiers == true) {
          p_Var11 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
        }
        else {
          p_Var11 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
        }
        bVar3 = StateRecorder::record_raytracing_pipeline
                          (this->recorder,(VkPipeline)0x0,&local_98,(VkPipeline *)0x0,0,0,device,
                           p_Var11);
        if (((!bVar3) && (LVar7 = get_thread_log_level(), (int)LVar7 < 2)) &&
           (bVar3 = Internal::log_thread_callback(LOG_DEFAULT,"Failed to capture eagerly.\n"),
           !bVar3)) {
          fwrite("Fossilize WARN: Failed to capture eagerly.\n",0x2b,1,_stderr);
        }
      }
      Instance::braceForRayTracingPipelineCrash(this->recorder,&local_98);
      VVar4 = (*this->pTable->CreateRayTracingPipelinesKHR)
                        (device,(VkDeferredOperationKHR)0x0,pipelineCache,1,&local_98,pAllocator,
                         ppVVar16);
      ppVVar21 = (VkPipeline *)(ulong)(uint)VVar4;
      Instance::completedPipelineCompilation();
      pipeline = (VkPipeline)0x0;
      if (VVar4 == VK_SUCCESS) {
        pipeline = *ppVVar16;
      }
      if (this->usesModuleIdentifiers == true) {
        p_Var11 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
      }
      else {
        p_Var11 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
      }
      bVar3 = StateRecorder::record_raytracing_pipeline
                        (this->recorder,pipeline,&local_98,(VkPipeline *)0x0,0,0,device,p_Var11);
      if (((!bVar3) && (LVar7 = get_thread_log_level(), (int)LVar7 < 2)) &&
         (bVar3 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "Failed to record compute pipeline, usually caused by unsupported pNext.\n"
                            ), !bVar3)) {
        fwrite("Fossilize WARN: Failed to record compute pipeline, usually caused by unsupported pNext.\n"
               ,0x58,1,_stderr);
      }
      if (VVar4 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) {
        VVar5 = VVar4;
      }
      bVar3 = VVar4 >= VK_SUCCESS;
      if (VVar4 < VK_SUCCESS) {
        for (lVar13 = 0; -lVar13 != lVar20; lVar13 = lVar13 + 1) {
          (*this->pTable->DestroyPipeline)(device,pPipelines[lVar13],pAllocator);
        }
      }
      else if ((VVar4 != VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) ||
              ((local_98.flags._1_1_ & 2) == 0)) goto LAB_00111114;
    }
    VVar6 = VK_OPERATION_NOT_DEFERRED_KHR;
    if (VVar5 != VK_SUCCESS) {
      VVar6 = VVar5;
    }
    if (deferredOperation == (VkDeferredOperationKHR)0x0) {
      VVar6 = VVar5;
    }
    if (!bVar3) {
      VVar6 = VVar4;
    }
  }
  return VVar6;
LAB_00111114:
  lVar20 = lVar20 + -1;
  ppVVar16 = ppVVar16 + 1;
  pCreateInfos = pCreateInfos + 1;
  goto LAB_00110f7a;
}

Assistant:

static VKAPI_ATTR VkResult VKAPI_CALL CreateRayTracingPipelinesKHR(
		VkDevice device, VkDeferredOperationKHR deferredOperation,
		VkPipelineCache pipelineCache, uint32_t createInfoCount,
		const VkRayTracingPipelineCreateInfoKHR *pCreateInfos,
		const VkAllocationCallbacks *pAllocator,
		VkPipeline *pPipelines)
{
	auto *layer = get_device_layer(device);

	if (layer->getInstance()->capturesParanoid())
	{
		return CreateRayTracingPipelinesParanoid(layer, device, deferredOperation, pipelineCache,
		                                         createInfoCount, pCreateInfos, pAllocator, pPipelines);
	}
	else
	{
		return CreateRayTracingPipelinesNormal(layer, device, deferredOperation, pipelineCache,
		                                       createInfoCount, pCreateInfos, pAllocator, pPipelines);
	}
}